

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O0

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::push_back
          (packed_gamma_file3<unsigned_int,_6UL> *this,uint64_t x)

{
  byte bVar1;
  size_type sVar2;
  value_type *pvVar3;
  reference pvVar4;
  uchar *puVar5;
  uint64_t in_RSI;
  packed_gamma_file3<unsigned_int,_6UL> *in_RDI;
  uint64_t i;
  uint8_t max_bitsize;
  value_type *in_stack_ffffffffffffffc8;
  value_type *__x;
  uint8_t local_21;
  value_type *local_20;
  uchar local_15;
  undefined4 local_14;
  uint64_t local_10;
  
  local_14 = (undefined4)in_RSI;
  local_10 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,in_stack_ffffffffffffffc8
            );
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->buffer);
  if (sVar2 % 6 == 0) {
    local_15 = '\0';
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->buffer);
    local_20 = (value_type *)(sVar2 - 6);
    while( true ) {
      __x = local_20;
      pvVar3 = (value_type *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->buffer);
      if (pvVar3 <= __x) break;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->buffer,(size_type)local_20);
      local_21 = wd(in_RDI,(ulong)*pvVar4);
      puVar5 = std::max<unsigned_char>(&local_15,&local_21);
      local_15 = *puVar5;
      local_20 = (value_type *)((long)local_20 + 1);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__x);
  }
  bVar1 = wd(in_RDI,local_10);
  in_RDI->lower_bound_bitsize = (ulong)bVar1 + in_RDI->lower_bound_bitsize;
  return;
}

Assistant:

void push_back(uint64_t x){

		assert(write);

		buffer.push_back(x);

		if(buffer.size()%block_size == 0){

			uint8_t max_bitsize = 0;

			for(uint64_t i=buffer.size()-block_size;i<buffer.size();++i){

				max_bitsize = std::max(max_bitsize,wd(buffer[i]));

			}

			blocks_bitsizes.push_back(max_bitsize);

		}

		lower_bound_bitsize += wd(x);


	}